

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.c
# Opt level: O0

void idct32_low8_ssse3(__m128i *input,__m128i *output)

{
  undefined1 (*pauVar1) [16];
  undefined1 (*pauVar2) [16];
  undefined8 uVar3;
  __m128i __rounding_00;
  __m128i __rounding_01;
  __m128i __rounding_02;
  __m128i __rounding_03;
  undefined1 auVar4 [16];
  __m128i __rounding_04;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined2 uVar16;
  short sVar17;
  int32_t *piVar18;
  undefined1 (*in_RDI) [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  __m128i _in_7;
  __m128i _w1_7;
  __m128i _w0_7;
  __m128i _in_6;
  __m128i _w1_6;
  __m128i _w0_6;
  __m128i _in_5;
  __m128i _w1_5;
  __m128i _w0_5;
  __m128i _in_4;
  __m128i _w1_4;
  __m128i _w0_4;
  __m128i _in_3;
  __m128i _w1_3;
  __m128i _w0_3;
  __m128i _in_2;
  __m128i _w1_2;
  __m128i _w0_2;
  __m128i _in_1;
  __m128i _w1_1;
  __m128i _w0_1;
  __m128i _in;
  __m128i _w1;
  __m128i _w0;
  __m128i x [32];
  __m128i __rounding;
  int32_t *cospi;
  int8_t cos_bit;
  __m128i *x_00;
  __m128i *output_00;
  int8_t iStack_5c1;
  longlong lStack_5c0;
  __m128i *palVar25;
  int32_t *piStack_590;
  int8_t cos_bit_00;
  longlong lVar26;
  longlong lVar27;
  int32_t *local_518;
  __m128i *palStack_510;
  int32_t *local_498;
  __m128i *palStack_490;
  int8_t cos_bit_01;
  longlong lVar28;
  longlong lVar29;
  int32_t *cospi_00;
  __m128i *x_01;
  undefined7 local_378;
  int8_t cos_bit_02;
  longlong lVar30;
  longlong lVar31;
  int32_t *cospi_01;
  __m128i *x_02;
  
  piVar18 = cospi_arr(0xc);
  uVar3 = *(undefined8 *)*in_RDI;
  lVar28 = *(longlong *)(*in_RDI + 8);
  auVar15 = *in_RDI;
  auVar14 = *in_RDI;
  pauVar1 = in_RDI + 4;
  cospi_00 = *(int32_t **)*pauVar1;
  x_01 = *(__m128i **)(in_RDI[4] + 8);
  pauVar2 = in_RDI + 2;
  lVar31 = *(longlong *)*pauVar2;
  x_00 = *(__m128i **)(in_RDI[1] + 8);
  uVar16 = (undefined2)(piVar18[0x3e] << 3);
  auVar13._2_2_ = uVar16;
  auVar13._0_2_ = uVar16;
  auVar13._4_2_ = uVar16;
  auVar13._6_2_ = uVar16;
  auVar13._10_2_ = uVar16;
  auVar13._8_2_ = uVar16;
  auVar13._12_2_ = uVar16;
  auVar13._14_2_ = uVar16;
  uVar16 = (undefined2)(piVar18[2] << 3);
  output_00 = (__m128i *)CONCAT26(uVar16,CONCAT24(uVar16,CONCAT22(uVar16,uVar16)));
  auVar12._10_2_ = uVar16;
  auVar12._8_2_ = uVar16;
  auVar12._12_2_ = uVar16;
  auVar12._14_2_ = uVar16;
  pmulhrsw(in_RDI[1],auVar13);
  auVar12._0_8_ = output_00;
  auVar19 = pmulhrsw(in_RDI[1],auVar12);
  sVar17 = (short)piVar18[0x32] * -8;
  auVar11._2_2_ = sVar17;
  auVar11._0_2_ = sVar17;
  auVar11._4_2_ = sVar17;
  auVar11._6_2_ = sVar17;
  auVar11._10_2_ = sVar17;
  auVar11._8_2_ = sVar17;
  auVar11._12_2_ = sVar17;
  auVar11._14_2_ = sVar17;
  uVar16 = (undefined2)(piVar18[0xe] << 3);
  auVar10._2_2_ = uVar16;
  auVar10._0_2_ = uVar16;
  auVar10._4_2_ = uVar16;
  auVar10._6_2_ = uVar16;
  auVar10._10_2_ = uVar16;
  auVar10._8_2_ = uVar16;
  auVar10._12_2_ = uVar16;
  auVar10._14_2_ = uVar16;
  pmulhrsw(in_RDI[7],auVar11);
  auVar20 = pmulhrsw(in_RDI[7],auVar10);
  uVar16 = (undefined2)(piVar18[0x36] << 3);
  auVar9._2_2_ = uVar16;
  auVar9._0_2_ = uVar16;
  auVar9._4_2_ = uVar16;
  auVar9._6_2_ = uVar16;
  auVar9._10_2_ = uVar16;
  auVar9._8_2_ = uVar16;
  auVar9._12_2_ = uVar16;
  auVar9._14_2_ = uVar16;
  uVar16 = (undefined2)(piVar18[10] << 3);
  auVar8._2_2_ = uVar16;
  auVar8._0_2_ = uVar16;
  auVar8._4_2_ = uVar16;
  auVar8._6_2_ = uVar16;
  auVar8._10_2_ = uVar16;
  auVar8._8_2_ = uVar16;
  auVar8._12_2_ = uVar16;
  auVar8._14_2_ = uVar16;
  auVar21 = pmulhrsw(in_RDI[5],auVar9);
  cos_bit_00 = auVar21[7];
  lVar26 = auVar21._8_8_;
  pmulhrsw(in_RDI[5],auVar8);
  sVar17 = (short)piVar18[0x3a] * -8;
  auVar7._2_2_ = sVar17;
  auVar7._0_2_ = sVar17;
  auVar7._4_2_ = sVar17;
  auVar7._6_2_ = sVar17;
  auVar7._10_2_ = sVar17;
  auVar7._8_2_ = sVar17;
  auVar7._12_2_ = sVar17;
  auVar7._14_2_ = sVar17;
  uVar16 = (undefined2)(piVar18[6] << 3);
  auVar6._2_2_ = uVar16;
  auVar6._0_2_ = uVar16;
  auVar6._4_2_ = uVar16;
  auVar6._6_2_ = uVar16;
  auVar6._10_2_ = uVar16;
  auVar6._8_2_ = uVar16;
  auVar6._12_2_ = uVar16;
  auVar6._14_2_ = uVar16;
  auVar22 = pmulhrsw(in_RDI[3],auVar7);
  pmulhrsw(in_RDI[3],auVar6);
  uVar16 = (undefined2)(piVar18[0x3c] << 3);
  cospi_01 = (int32_t *)CONCAT26(uVar16,CONCAT24(uVar16,CONCAT22(uVar16,uVar16)));
  x_02 = (__m128i *)CONCAT26(uVar16,CONCAT24(uVar16,CONCAT22(uVar16,uVar16)));
  uVar16 = (undefined2)(piVar18[4] << 3);
  lVar30 = CONCAT26(uVar16,CONCAT24(uVar16,CONCAT22(uVar16,uVar16)));
  auVar5._8_8_ = x_02;
  auVar5._0_8_ = cospi_01;
  pmulhrsw(*pauVar2,auVar5);
  local_378 = (undefined7)CONCAT26(uVar16,CONCAT24(uVar16,CONCAT22(uVar16,uVar16)));
  cos_bit_02 = (int8_t)((uint)(piVar18[4] << 3) >> 8);
  auVar23[7] = cos_bit_02;
  auVar23._0_7_ = local_378;
  auVar23._8_8_ = lVar30;
  auVar23 = pmulhrsw(*pauVar2,auVar23);
  sVar17 = (short)piVar18[0x34] * -8;
  auVar4._2_2_ = sVar17;
  auVar4._0_2_ = sVar17;
  auVar4._4_2_ = sVar17;
  auVar4._6_2_ = sVar17;
  auVar4._10_2_ = sVar17;
  auVar4._8_2_ = sVar17;
  auVar4._12_2_ = sVar17;
  auVar4._14_2_ = sVar17;
  uVar16 = (undefined2)(piVar18[0xc] << 3);
  auVar24._2_2_ = uVar16;
  auVar24._0_2_ = uVar16;
  auVar24._4_2_ = uVar16;
  auVar24._6_2_ = uVar16;
  auVar24._10_2_ = uVar16;
  auVar24._8_2_ = uVar16;
  auVar24._12_2_ = uVar16;
  auVar24._14_2_ = uVar16;
  pmulhrsw(in_RDI[6],auVar4);
  auVar24 = pmulhrsw(in_RDI[6],auVar24);
  lVar27 = auVar21._0_8_;
  local_518 = auVar22._0_8_;
  palStack_510 = auVar22._8_8_;
  local_498 = auVar19._0_8_;
  palStack_490 = auVar19._8_8_;
  uVar16 = (undefined2)(piVar18[0x38] << 3);
  auVar22._2_2_ = uVar16;
  auVar22._0_2_ = uVar16;
  auVar22._4_2_ = uVar16;
  auVar22._6_2_ = uVar16;
  auVar22._10_2_ = uVar16;
  auVar22._8_2_ = uVar16;
  auVar22._12_2_ = uVar16;
  auVar22._14_2_ = uVar16;
  uVar16 = (undefined2)(piVar18[8] << 3);
  lVar29 = CONCAT26(uVar16,CONCAT24(uVar16,CONCAT22(uVar16,uVar16)));
  auVar21._10_2_ = uVar16;
  auVar21._8_2_ = uVar16;
  auVar21._12_2_ = uVar16;
  auVar21._14_2_ = uVar16;
  pmulhrsw(*pauVar1,auVar22);
  auVar21._0_8_ = lVar29;
  pmulhrsw(*pauVar1,auVar21);
  iStack_5c1 = auVar24[7];
  lStack_5c0 = auVar24._8_8_;
  piStack_590 = auVar23._8_8_;
  __rounding_02[1] = auVar20._0_8_;
  __rounding_02[0] = auVar20._8_8_;
  palVar25 = auVar23._0_8_;
  idct32_high16_stage4_sse2(palStack_490,local_498,__rounding_02,auVar20[7]);
  uVar16 = (undefined2)(piVar18[0x20] << 3);
  auVar20._2_2_ = uVar16;
  auVar20._0_2_ = uVar16;
  auVar20._4_2_ = uVar16;
  auVar20._6_2_ = uVar16;
  auVar20._10_2_ = uVar16;
  auVar20._8_2_ = uVar16;
  auVar20._12_2_ = uVar16;
  auVar20._14_2_ = uVar16;
  uVar16 = (undefined2)(piVar18[0x20] << 3);
  auVar19._2_2_ = uVar16;
  auVar19._0_2_ = uVar16;
  auVar19._4_2_ = uVar16;
  auVar19._6_2_ = uVar16;
  auVar19._10_2_ = uVar16;
  auVar19._8_2_ = uVar16;
  auVar19._12_2_ = uVar16;
  auVar19._14_2_ = uVar16;
  cos_bit_01 = (int8_t)((ulong)uVar3 >> 0x38);
  pmulhrsw(auVar14,auVar20);
  pmulhrsw(auVar15,auVar19);
  __rounding_00[1] = (longlong)palVar25;
  __rounding_00[0] = lStack_5c0;
  idct32_high24_stage5_sse2(auVar23._0_8_,piStack_590,__rounding_00,iStack_5c1);
  __rounding_04[1] = lVar31;
  __rounding_04[0] = lVar30;
  idct32_high28_stage6_sse2(x_02,cospi_01,__rounding_04,cos_bit_02);
  __rounding_01[1] = lVar27;
  __rounding_01[0] = lVar26;
  idct32_stage7_sse2(palStack_510,local_518,__rounding_01,cos_bit_00);
  __rounding_03[1] = lVar29;
  __rounding_03[0] = lVar28;
  idct32_stage8_sse2(x_01,cospi_00,__rounding_03,cos_bit_01);
  idct32_stage9_sse2(output_00,x_00);
  return;
}

Assistant:

static void idct32_low8_ssse3(const __m128i *input, __m128i *output) {
  const int8_t cos_bit = INV_COS_BIT;
  const int32_t *cospi = cospi_arr(INV_COS_BIT);
  const __m128i __rounding = _mm_set1_epi32(1 << (INV_COS_BIT - 1));

  // stage 1
  __m128i x[32];
  x[0] = input[0];
  x[4] = input[4];
  x[8] = input[2];
  x[12] = input[6];
  x[16] = input[1];
  x[20] = input[5];
  x[24] = input[3];
  x[28] = input[7];

  // stage 2
  btf_16_ssse3(cospi[62], cospi[2], x[16], x[16], x[31]);
  btf_16_ssse3(-cospi[50], cospi[14], x[28], x[19], x[28]);
  btf_16_ssse3(cospi[54], cospi[10], x[20], x[20], x[27]);
  btf_16_ssse3(-cospi[58], cospi[6], x[24], x[23], x[24]);

  // stage 3
  btf_16_ssse3(cospi[60], cospi[4], x[8], x[8], x[15]);
  btf_16_ssse3(-cospi[52], cospi[12], x[12], x[11], x[12]);
  x[17] = x[16];
  x[18] = x[19];
  x[21] = x[20];
  x[22] = x[23];
  x[25] = x[24];
  x[26] = x[27];
  x[29] = x[28];
  x[30] = x[31];

  // stage 4
  btf_16_ssse3(cospi[56], cospi[8], x[4], x[4], x[7]);
  x[9] = x[8];
  x[10] = x[11];
  x[13] = x[12];
  x[14] = x[15];
  idct32_high16_stage4_sse2(x, cospi, __rounding, cos_bit);

  // stage 5
  btf_16_ssse3(cospi[32], cospi[32], x[0], x[0], x[1]);
  x[5] = x[4];
  x[6] = x[7];
  idct32_high24_stage5_sse2(x, cospi, __rounding, cos_bit);
  // stage 6
  x[3] = x[0];
  x[2] = x[1];
  idct32_high28_stage6_sse2(x, cospi, __rounding, cos_bit);

  idct32_stage7_sse2(x, cospi, __rounding, cos_bit);
  idct32_stage8_sse2(x, cospi, __rounding, cos_bit);
  idct32_stage9_sse2(output, x);
}